

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O0

void printName(PSNode *node,bool dot)

{
  bool bVar1;
  Value *pVVar2;
  byte in_SIL;
  PSNode *in_RDI;
  int i;
  char *name;
  string nm;
  Value *in_stack_00000178;
  int local_64;
  string local_60 [36];
  undefined4 local_3c;
  char *local_38;
  string local_30 [39];
  byte local_9;
  PSNode *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  local_38 = (char *)0x0;
  bVar1 = dg::pta::PSNode::isNull(local_8);
  if (bVar1) {
    local_38 = "null";
  }
  else {
    bVar1 = dg::pta::PSNode::isUnknownMemory(local_8);
    if (bVar1) {
      local_38 = "unknown";
    }
  }
  if (local_38 == (char *)0x0) {
    pVVar2 = dg::SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
                       ((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
    if (pVVar2 == (Value *)0x0) {
      dg::pta::PSNode::getType(local_8);
      printPSNodeType(0);
      if ((local_9 & 1) == 0) {
        printf(" %p\n",local_8);
      }
      else {
        printf(" %p\\n",local_8);
      }
      local_3c = 1;
      goto LAB_0014e9e8;
    }
    dg::SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
              ((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
    getInstName_abi_cxx11_(in_stack_00000178);
    std::__cxx11::string::operator=(local_30,local_60);
    std::__cxx11::string::~string(local_60);
    local_38 = (char *)std::__cxx11::string::c_str();
  }
  for (local_64 = 0; local_38[local_64] != '\0'; local_64 = local_64 + 1) {
    if (0x45 < local_64) {
      printf(" ...");
      break;
    }
    if (local_38[local_64] == '\"') {
      putchar(0x5c);
    }
    putchar((int)local_38[local_64]);
  }
  local_3c = 0;
LAB_0014e9e8:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void printName(PSNode *node, bool dot) {
    std::string nm;
    const char *name = nullptr;
    if (node->isNull()) {
        name = "null";
    } else if (node->isUnknownMemory()) {
        name = "unknown";
    }

    if (!name) {
        if (!node->getUserData<llvm::Value>()) {
            printPSNodeType(node->getType());
            if (dot)
                printf(" %p\\n", node);
            else
                printf(" %p\n", node);

            return;
        }

        nm = getInstName(node->getUserData<llvm::Value>());
        name = nm.c_str();
    }

    // escape the " character
    for (int i = 0; name[i] != '\0'; ++i) {
        // crop long names
        if (i >= 70) {
            printf(" ...");
            break;
        }

        if (name[i] == '"')
            putchar('\\');

        putchar(name[i]);
    }
}